

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O3

int nh_http_parse_consume_header(http_context_t *ctx)

{
  uint32_t *puVar1;
  uint uVar2;
  char *pcVar3;
  int iVar4;
  nh_kv_anchor_t *__ptr;
  long lVar5;
  uint uVar6;
  uint32_t uVar7;
  ulong uVar8;
  
  __ptr = (ctx->header).items;
  if (__ptr == (nh_kv_anchor_t *)0x0) {
    __ptr = (nh_kv_anchor_t *)malloc(0x80);
    (ctx->header).items = __ptr;
    (ctx->header).capacity = 8;
    (ctx->header).length = 0;
  }
  uVar2 = (ctx->raw).index;
  pcVar3 = (ctx->raw).buf;
  lVar5 = -0x80;
  while ((iVar4 = (int)lVar5, pcVar3[uVar2 + iVar4 + 0x80] != ':' ||
         (pcVar3[uVar2 + iVar4 + 0x81] != ' '))) {
    lVar5 = lVar5 + 1;
    if (lVar5 == 0) {
      return 0;
    }
  }
  if ((int)(iVar4 + 0x80U) < 0) {
    return 0;
  }
  uVar8 = (ulong)uVar2 + lVar5 + 0x82;
  uVar7 = (uint32_t)uVar8;
  (ctx->raw).index = uVar7;
  lVar5 = 0;
  uVar8 = uVar8 & 0xffffffff;
  do {
    if (pcVar3[uVar8] == '\r') {
      if (-1 < (int)lVar5) {
        return 0;
      }
      (ctx->raw).index = (uint32_t)uVar8;
      uVar6 = (ctx->header).length;
      if (uVar6 == (ctx->header).capacity) {
        (ctx->header).capacity = uVar6 * 2;
        __ptr = (nh_kv_anchor_t *)realloc(__ptr,(ulong)(uVar6 * 2) << 4);
        (ctx->header).items = __ptr;
        if (__ptr == (nh_kv_anchor_t *)0x0) {
          __assert_fail("ctx->header.items != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/unbyte[P]naive-httpserver/lib/server.c"
                        ,0x21b,"int nh_http_parse_consume_header(http_context_t *)");
        }
        uVar6 = (ctx->header).length;
      }
      __ptr[uVar6].key.index = uVar2;
      __ptr[uVar6].key.len = iVar4 + 0x80U;
      __ptr[uVar6].value.index = uVar7;
      __ptr[uVar6].value.len = -(int)lVar5;
      puVar1 = &(ctx->header).length;
      *puVar1 = *puVar1 + 1;
      return 1;
    }
    lVar5 = lVar5 + -1;
    uVar8 = (ulong)((uint32_t)uVar8 + 1);
  } while (lVar5 != -0x400);
  return 0;
}

Assistant:

int nh_http_parse_consume_header(http_context_t *ctx) {
    if (ctx->header.items == NULL) {
        ctx->header.items = (nh_kv_anchor_t *) malloc(sizeof(nh_kv_anchor_t) * REQUEST_HEADER_INIT_SIZE);
        ctx->header.capacity = REQUEST_HEADER_INIT_SIZE;
        ctx->header.length = 0;
    }

    nh_stream_t *stream = &ctx->raw;
    uint32_t key_index = stream->index;
    int key_offset;
    if ((key_offset = nh_stream_find_next_char_tuple(stream, ": ", 128)) < 0) return 0;

    stream->index += key_offset + 2;
    uint32_t value_index = stream->index;

    int value_offset;
    if ((value_offset = nh_stream_find_next(stream, '\r', 1024)) <= 0) return 0;

    stream->index += value_offset;

    if (ctx->header.length == ctx->header.capacity) {
        ctx->header.capacity *= 2;
        ctx->header.items = (nh_kv_anchor_t *) realloc(ctx->header.items,
                                                       ctx->header.capacity * sizeof(nh_kv_anchor_t));
        assert(ctx->header.items != NULL);
    }

    ctx->header.items[ctx->header.length] = (nh_kv_anchor_t) {
        .key = {.index = key_index, .len = key_offset},
        .value = {.index = value_index, .len = value_offset}
    };
    ctx->header.length++;
    return 1;
}